

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

int Dch_ObjCheckTfi(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  int iVar1;
  Aig_Obj_t *pAStack_28;
  int RetValue;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pRepr_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                  ,0x18d,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pRepr);
  pAStack_28 = pRepr;
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pRepr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                  ,0x18e,"int Dch_ObjCheckTfi(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  for (; pAStack_28 != (Aig_Obj_t *)0x0; pAStack_28 = Aig_ObjEquiv(p,pAStack_28)) {
    *(ulong *)&pAStack_28->field_0x18 =
         *(ulong *)&pAStack_28->field_0x18 & 0xffffffffffffffef | 0x10;
  }
  Aig_ManIncrementTravId(p);
  iVar1 = Dch_ObjCheckTfi_rec(p,pObj);
  for (pAStack_28 = pRepr; pAStack_28 != (Aig_Obj_t *)0x0; pAStack_28 = Aig_ObjEquiv(p,pAStack_28))
  {
    *(ulong *)&pAStack_28->field_0x18 = *(ulong *)&pAStack_28->field_0x18 & 0xffffffffffffffef;
  }
  return iVar1;
}

Assistant:

int Dch_ObjCheckTfi( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pTemp;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_IsComplement(pRepr) );
    // mark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 1;
    // traverse the new node
    Aig_ManIncrementTravId( p );
    RetValue = Dch_ObjCheckTfi_rec( p, pObj );
    // unmark nodes of the choice node
    for ( pTemp = pRepr; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        pTemp->fMarkA = 0;
    return RetValue;
}